

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::Logger::flush(Logger *this)

{
  char cVar1;
  EnumType lIndex;
  uint local_34;
  Logger *local_30;
  uint *local_28;
  code *local_20;
  code *local_18;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_28 = &local_34;
  local_34 = 2;
  local_18 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/easylogging++/easylogging++.cc:604:38)>
             ::_M_invoke;
  local_20 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/easylogging++/easylogging++.cc:604:38)>
             ::_M_manager;
  local_30 = this;
  do {
    cVar1 = (*local_18)(&local_30);
    if ((cVar1 != '\0') || (local_34 = local_34 * 2, 0x80 < local_34)) goto LAB_0015961a;
  } while (local_20 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_0015961a:
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return;
}

Assistant:

void Logger::flush(void) {
  ELPP_INTERNAL_INFO(3, "Flushing logger [" << m_id << "] all levels");
  base::threading::ScopedLock scopedLock(lock());
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    flush(LevelHelper::castFromInt(lIndex), nullptr);
    return false;
  });
}